

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86SUB(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,x86Reg op2)

{
  uchar *puVar1;
  uint uVar2;
  
  if (size - sDWORD < 2) {
    uVar2 = encodeRex(stream,size == sQWORD,op2,index,base);
    puVar1 = stream + uVar2;
    *puVar1 = ')';
    uVar2 = encodeAddress(puVar1 + 1,index,multiplier,base,shift,(int)regCode[op2]);
    return (uVar2 + (int)(puVar1 + 1)) - (int)stream;
  }
  __assert_fail("size == sDWORD || size == sQWORD",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x551,"int x86SUB(unsigned char *, x86Size, x86Reg, int, x86Reg, int, x86Reg)");
}

Assistant:

int x86SUB(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86Reg op2)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, op2, index, base);
	*stream++ = 0x29;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[op2]);

	return int(stream - start);
}